

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_indicator_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6f2d0e::ServiceIndicatorTest_BasicTest_Test::TestBody
          (ServiceIndicatorTest_BasicTest_Test *this)

{
  int iVar1;
  EVP_AEAD *pEVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar4;
  FIPSStatus approved;
  size_t out_len;
  uint8_t nonce [32];
  uint64_t before;
  uint8_t output [256];
  ScopedEVP_AEAD_CTX aead_ctx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3d8;
  Message local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  AssertHelper local_3c0;
  undefined1 local_3b4 [4];
  undefined1 local_3b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  size_t local_390;
  AssertHelper local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  uint64_t local_360;
  Message local_358 [33];
  undefined1 local_250 [8];
  evp_aead_ctx_st_state local_248;
  
  local_3b4 = (undefined1  [4])0x0;
  local_360 = FIPS_service_indicator_before_call();
  local_358[0].ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_250,"before","(uint64_t)0",&local_360,(unsigned_long *)local_358);
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message(local_358);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248.alignment ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_248.alignment;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
               ,0x960,pcVar3);
    testing::internal::AssertHelper::operator=(&local_388,local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_358[0].ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_358[0].ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248.alignment ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_250 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_248.alignment);
    return;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248.alignment !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_250 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_248.alignment);
  }
  EVP_AEAD_CTX_zero((EVP_AEAD_CTX *)local_250);
  local_378 = 0;
  uStack_370 = 0;
  local_388.data_ = (AssertHelperData *)0x0;
  uStack_380 = 0;
  pEVar2 = EVP_aead_aes_128_gcm_randnonce();
  pcVar3 = (char *)0x0;
  iVar1 = EVP_AEAD_CTX_init((EVP_AEAD_CTX *)local_250,pEVar2,(anonymous_namespace)::kAESKey,0x10,0,
                            (ENGINE *)0x0);
  local_3d0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_3d0.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,iVar1 != 0);
  local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3b0,(internal *)&local_3d0,
               (AssertionResult *)
               "EVP_AEAD_CTX_init(aead_ctx.get(), EVP_aead_aes_128_gcm_randnonce(), kAESKey, sizeof(kAESKey), 0, nullptr)"
               ,"false","true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
               ,0x969,(char *)local_3b0);
    testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d8);
LAB_002fcb43:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3c8;
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    if (local_3b0 != (undefined1  [8])&local_3a0) {
      operator_delete((void *)local_3b0,local_3a0._M_allocated_capacity + 1);
    }
    if (local_3d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3d8._M_head_impl + 8))();
    }
    __ptr = local_3c8;
    if (local_3c8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_002fcb8a;
  }
  else {
    local_3b0 = (undefined1  [8])local_3b4;
    local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                FIPS_service_indicator_before_call();
    local_3b4 = (undefined1  [4])0x0;
    pcVar3 = (char *)0x0;
    iVar1 = EVP_AEAD_CTX_seal((EVP_AEAD_CTX *)local_250,(uint8_t *)local_358,&local_390,0x100,
                              (uint8_t *)0x0,0,(anonymous_namespace)::kPlaintext,0x40,(uint8_t *)0x0
                              ,0);
    bssl::FIPSIndicatorHelper::~FIPSIndicatorHelper((FIPSIndicatorHelper *)local_3b0);
    local_3d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_3d0.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,iVar1 != 0);
    local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_3d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3b0,(internal *)&local_3d0,
                 (AssertionResult *)
                 "[&] { bssl::FIPSIndicatorHelper fips_indicator_helper(&approved); return EVP_AEAD_CTX_seal(aead_ctx.get(), output, &out_len, sizeof(output), nullptr, 0, kPlaintext, sizeof(kPlaintext), nullptr, 0); }()"
                 ,"false","true",pcVar3);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                 ,0x96d,(char *)local_3b0);
      testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d8);
      goto LAB_002fcb43;
    }
    local_3d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<bssl::FIPSStatus,bssl::FIPSStatus>
              ((internal *)local_3b0,"approved","FIPSStatus::APPROVED",
               (FIPSStatus *)
               &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3b4)->_M_allocated_capacity,(FIPSStatus *)&local_3d0);
    if (local_3b0[0] == '\0') {
      testing::Message::Message(&local_3d0);
      if (local_3a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_3a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                 ,0x96f,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,&local_3d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
      if ((long *)CONCAT44(local_3d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_3d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_3d0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_3d0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    if (local_3a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3a8,local_3a8);
    }
    pEVar2 = EVP_aead_aes_128_gcm();
    pcVar3 = (char *)0x0;
    iVar1 = EVP_AEAD_CTX_init((EVP_AEAD_CTX *)local_250,pEVar2,(anonymous_namespace)::kAESKey,0x10,0
                              ,(ENGINE *)0x0);
    local_3d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_3d0.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,iVar1 != 0);
    local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_3d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3b0,(internal *)&local_3d0,
                 (AssertionResult *)
                 "EVP_AEAD_CTX_init(aead_ctx.get(), EVP_aead_aes_128_gcm(), kAESKey, sizeof(kAESKey), 0, nullptr)"
                 ,"false","true",pcVar3);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                 ,0x973,(char *)local_3b0);
      testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d8);
      goto LAB_002fcb43;
    }
    local_3b0 = (undefined1  [8])local_3b4;
    local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                FIPS_service_indicator_before_call();
    local_3b4 = (undefined1  [4])0x0;
    pEVar2 = EVP_aead_aes_128_gcm();
    pcVar3 = (char *)EVP_AEAD_nonce_length(pEVar2);
    iVar1 = EVP_AEAD_CTX_seal((EVP_AEAD_CTX *)local_250,(uint8_t *)local_358,&local_390,0x100,
                              (uint8_t *)&local_388,(size_t)pcVar3,(anonymous_namespace)::kPlaintext
                              ,0x40,(uint8_t *)0x0,0);
    bssl::FIPSIndicatorHelper::~FIPSIndicatorHelper((FIPSIndicatorHelper *)local_3b0);
    local_3d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_3d0.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,iVar1 != 0);
    local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_3d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_3b0,(internal *)&local_3d0,
                 (AssertionResult *)
                 "[&] { bssl::FIPSIndicatorHelper fips_indicator_helper(&approved); return EVP_AEAD_CTX_seal(aead_ctx.get(), output, &out_len, sizeof(output), nonce, EVP_AEAD_nonce_length(EVP_aead_aes_128_gcm()), kPlaintext, sizeof(kPlaintext), nullptr, 0); }()"
                 ,"false","true",pcVar3);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                 ,0x978,(char *)local_3b0);
      testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d8);
      goto LAB_002fcb43;
    }
    local_3d0.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<bssl::FIPSStatus,bssl::FIPSStatus>
              ((internal *)local_3b0,"approved","FIPSStatus::APPROVED",(FIPSStatus *)local_3b4,
               (FIPSStatus *)&local_3d0);
    if (local_3b0[0] == '\0') {
      testing::Message::Message(&local_3d0);
      if (local_3a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_3a8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/service_indicator/service_indicator_test.cc"
                 ,0x979,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,&local_3d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
      if ((long *)CONCAT44(local_3d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_3d0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_3d0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_3d0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    if (local_3a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_002fcb8a;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_3a8;
    __ptr = local_3a8;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr);
LAB_002fcb8a:
  EVP_AEAD_CTX_cleanup((EVP_AEAD_CTX *)local_250);
  return;
}

Assistant:

TEST(ServiceIndicatorTest, BasicTest) {
  // Reset and check the initial state and counter.
  FIPSStatus approved = FIPSStatus::NOT_APPROVED;
  uint64_t before = FIPS_service_indicator_before_call();
  ASSERT_EQ(before, (uint64_t)0);

  // Call an approved service.
  bssl::ScopedEVP_AEAD_CTX aead_ctx;
  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH] = {0};
  uint8_t output[256];
  size_t out_len;
  ASSERT_TRUE(EVP_AEAD_CTX_init(aead_ctx.get(),
                                EVP_aead_aes_128_gcm_randnonce(), kAESKey,
                                sizeof(kAESKey), 0, nullptr));
  ASSERT_TRUE(CALL_SERVICE_AND_CHECK_APPROVED(
      approved, EVP_AEAD_CTX_seal(aead_ctx.get(), output, &out_len,
                                  sizeof(output), nullptr, 0, kPlaintext,
                                  sizeof(kPlaintext), nullptr, 0)));
  // Macro should return true, to ensure FIPS/non-FIPS compatibility.
  EXPECT_EQ(approved, FIPSStatus::APPROVED);

  // Call a non-approved service.
  ASSERT_TRUE(EVP_AEAD_CTX_init(aead_ctx.get(), EVP_aead_aes_128_gcm(), kAESKey,
                                sizeof(kAESKey), 0, nullptr));
  ASSERT_TRUE(CALL_SERVICE_AND_CHECK_APPROVED(
      approved,
      EVP_AEAD_CTX_seal(aead_ctx.get(), output, &out_len, sizeof(output), nonce,
                        EVP_AEAD_nonce_length(EVP_aead_aes_128_gcm()),
                        kPlaintext, sizeof(kPlaintext), nullptr, 0)));
  EXPECT_EQ(approved, FIPSStatus::APPROVED);
}